

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_sort.cpp
# Opt level: O3

OrderByNullType duckdb::GetOrder<duckdb::OrderByNullType>(ClientContext *context,Expression *expr)

{
  OrderByNullType OVar1;
  int iVar2;
  InvalidInputException *this;
  string order_name;
  Value order_value;
  string local_a0;
  string local_80;
  Value local_60;
  
  iVar2 = (*(expr->super_BaseExpression)._vptr_BaseExpression[0xf])(expr);
  if ((char)iVar2 != '\0') {
    ExpressionExecutor::EvaluateScalar(&local_60,context,expr,false);
    Value::ToString_abi_cxx11_(&local_a0,&local_60);
    StringUtil::Upper(&local_80,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    OVar1 = EnumUtil::FromString<duckdb::OrderByNullType>(local_80._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    Value::~Value(&local_60);
    return OVar1;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_60.type_._0_8_ = (long)&local_60 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"Sorting order must be a constant","");
  InvalidInputException::InvalidInputException(this,(string *)&local_60);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static T GetOrder(ClientContext &context, Expression &expr) {
	if (!expr.IsFoldable()) {
		throw InvalidInputException("Sorting order must be a constant");
	}
	Value order_value = ExpressionExecutor::EvaluateScalar(context, expr);
	auto order_name = StringUtil::Upper(order_value.ToString());
	return EnumUtil::FromString<T>(order_name.c_str());
}